

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

void flexbuffers::AppendToString<flexbuffers::FixedTypedVector>
               (string *s,FixedTypedVector *v,bool keys_quoted,bool indented,int cur_indent,
               char *indent_string,bool natural_utf8)

{
  size_t i;
  ulong i_00;
  Reference local_40;
  
  std::__cxx11::string::append((char *)s);
  std::__cxx11::string::append((char *)s);
  for (i_00 = 0; i_00 < v->len_; i_00 = i_00 + 1) {
    if (i_00 != 0) {
      std::__cxx11::string::append((char *)s);
      std::__cxx11::string::append((char *)s);
    }
    if (indented) {
      IndentString(s,cur_indent,indent_string);
    }
    local_40 = FixedTypedVector::operator[](v,i_00);
    Reference::ToString(&local_40,true,keys_quoted,s,indented,cur_indent,indent_string,natural_utf8)
    ;
  }
  if (indented) {
    std::__cxx11::string::append((char *)s);
    IndentString(s,cur_indent + -1,indent_string);
  }
  else {
    std::__cxx11::string::append((char *)s);
  }
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

void AppendToString(std::string &s, T &&v, bool keys_quoted, bool indented,
                    int cur_indent, const char *indent_string,
                    bool natural_utf8) {
  s += "[";
  s += indented ? "\n" : " ";
  for (size_t i = 0; i < v.size(); i++) {
    if (i) {
      s += ",";
      s += indented ? "\n" : " ";
    }
    if (indented) IndentString(s, cur_indent, indent_string);
    v[i].ToString(true, keys_quoted, s, indented, cur_indent,
                  indent_string, natural_utf8);
  }
  if (indented) {
    s += "\n";
    IndentString(s, cur_indent - 1, indent_string);
  } else {
    s += " ";
  }
  s += "]";
}